

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O1

void hexdumpgroups<unsigned_char*>(string *str,uchar *buf,size_t nLength,int groupsize,char sep)

{
  size_t sVar1;
  char *p;
  int iVar2;
  
  iVar2 = 0;
  std::__cxx11::string::resize((ulong)str,(char)str->_M_string_length + (char)nLength * '\x03');
  if (nLength != 0) {
    p = (str->_M_dataplus)._M_p + str->_M_string_length + nLength * -3;
    sVar1 = 0;
    do {
      byte2hexchars(buf[sVar1],p);
      if (iVar2 == groupsize + -1) {
        p[2] = sep;
        p = p + 3;
        iVar2 = 0;
      }
      else {
        p = p + 2;
        iVar2 = iVar2 + 1;
      }
      sVar1 = sVar1 + 1;
    } while (nLength != sVar1);
  }
  return;
}

Assistant:

void hexdumpgroups(std::string &str, I buf, size_t nLength, int groupsize, char sep=' ')
{
    str.resize(str.size()+nLength*3);
    char *p= &str[str.size()-nLength*3];
    int i= 0;
    while(nLength--)
    {
        byte2hexchars(get8(buf), p); p+=2; buf++;

        if (i++ == groupsize-1) {
            *p++ = sep;
            i= 0;
        }
    }
}